

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndMenu(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  undefined1 unaff_retaddr;
  int unaff_retaddr_00;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((((GImGui->NavMoveDir == 0) && (bVar3 = NavMoveRequestButNoResultYet(), bVar3)) &&
      ((pIVar1->DC).LayoutType == 1)) &&
     (((pIVar2->NavWindow != (ImGuiWindow *)0x0 &&
       ((pIVar2->NavWindow->RootWindowForNav->Flags & 0x4000000U) != 0)) &&
      (pIVar2->NavWindow->RootWindowForNav->ParentWindow == pIVar1)))) {
    ClosePopupToLevel(unaff_retaddr_00,(bool)unaff_retaddr);
    NavMoveRequestCancel();
  }
  EndPopup();
  return;
}

Assistant:

void ImGui::EndMenu()
{
    // Nav: When a left move request _within our child menu_ failed, close ourselves (the _parent_ menu).
    // A menu doesn't close itself because EndMenuBar() wants the catch the last Left<>Right inputs.
    // However, it means that with the current code, a BeginMenu() from outside another menu or a menu-bar won't be closable with the Left direction.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavMoveDir == ImGuiDir_Left && NavMoveRequestButNoResultYet() && window->DC.LayoutType == ImGuiLayoutType_Vertical)
        if (g.NavWindow && (g.NavWindow->RootWindowForNav->Flags & ImGuiWindowFlags_Popup) && g.NavWindow->RootWindowForNav->ParentWindow == window)
        {
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
            NavMoveRequestCancel();
        }

    EndPopup();
}